

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFComment.cpp
# Opt level: O0

void __thiscall PDFComment::~PDFComment(PDFComment *this)

{
  PDFComment *this_local;
  
  PDFDate::~PDFDate(&this->Time);
  CMYKRGBColor::~CMYKRGBColor(&this->Color);
  std::__cxx11::string::~string((string *)&this->CommentatorName);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

PDFComment::~PDFComment(void)
{
}